

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O3

void liu::get_input_label(string *filename,Mat *input,Mat *label,int sample_num,int start)

{
  FileStorage fs;
  Mat target_;
  Mat input_;
  int local_1a8 [3];
  undefined4 local_19c;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [80];
  FileStorage local_130 [64];
  Mat local_f0 [8];
  undefined4 local_e8;
  Mat local_90 [8];
  undefined4 local_88;
  
  cv::FileStorage::FileStorage(local_130);
  local_188 = 0;
  local_180[0] = 0;
  local_190 = local_180;
  cv::FileStorage::open((string *)local_130,(int)filename,(string *)0x0);
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_f0);
  cv::FileStorage::operator[]((char *)local_1a8);
  cv::Mat::Mat((Mat *)&local_190);
  cv::read((FileNode *)local_1a8,local_90,(Mat *)&local_190);
  cv::Mat::~Mat((Mat *)&local_190);
  cv::FileStorage::operator[]((char *)local_1a8);
  cv::Mat::Mat((Mat *)&local_190);
  cv::read((FileNode *)local_1a8,local_f0,(Mat *)&local_190);
  cv::Mat::~Mat((Mat *)&local_190);
  cv::FileStorage::release();
  local_1a8[1] = 0;
  local_19c = local_88;
  local_1a8[0] = start;
  local_1a8[2] = sample_num;
  cv::Mat::Mat((Mat *)&local_190,local_90,(Rect_ *)local_1a8);
  cv::Mat::operator=(input,(Mat *)&local_190);
  cv::Mat::~Mat((Mat *)&local_190);
  local_1a8[1] = 0;
  local_19c = local_e8;
  local_1a8[0] = start;
  local_1a8[2] = sample_num;
  cv::Mat::Mat((Mat *)&local_190,local_f0,(Rect_ *)local_1a8);
  cv::Mat::operator=(label,(Mat *)&local_190);
  cv::Mat::~Mat((Mat *)&local_190);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  cv::FileStorage::~FileStorage(local_130);
  return;
}

Assistant:

void get_input_label(std::string filename, cv::Mat& input, cv::Mat& label, int sample_num, int start)
	{
		cv::FileStorage fs;
		fs.open(filename, cv::FileStorage::READ);
		cv::Mat input_, target_;
		fs["input"] >> input_;
		fs["target"] >> target_;
		fs.release();
		input = input_(cv::Rect(start, 0, sample_num, input_.rows));
		label = target_(cv::Rect(start, 0, sample_num, target_.rows));
	}